

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_tri_quality(REF_NODE ref_node,REF_INT *nodes,REF_DBL *quality)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL *quality_local;
  REF_INT *nodes_local;
  REF_NODE ref_node_local;
  
  if (ref_node->tri_quality == 1) {
    uVar1 = ref_node_tri_epic_quality(ref_node,nodes,quality);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x806,
             "ref_node_tri_quality",(ulong)uVar1,"epic");
      return uVar1;
    }
  }
  else {
    if (ref_node->tri_quality != 2) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x80c,
             "ref_node_tri_quality","case not recognized");
      return 1;
    }
    uVar1 = ref_node_tri_jac_quality(ref_node,nodes,quality);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x809,
             "ref_node_tri_quality",(ulong)uVar1,"epic");
      return uVar1;
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_node_tri_quality(REF_NODE ref_node, REF_INT *nodes,
                                        REF_DBL *quality) {
  switch (ref_node->tri_quality) {
    case REF_NODE_EPIC_QUALITY:
      RSS(ref_node_tri_epic_quality(ref_node, nodes, quality), "epic");
      break;
    case REF_NODE_JAC_QUALITY:
      RSS(ref_node_tri_jac_quality(ref_node, nodes, quality), "epic");
      break;
    default:
      THROW("case not recognized");
  }
  return REF_SUCCESS;
}